

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O0

void testCompression(string *tempDir)

{
  pixelArray *array_00;
  ostream *this;
  exception *e;
  pixelArray array;
  int DY;
  int DX;
  int H;
  int W;
  undefined8 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  pixelArray *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  pixelArray *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  pixelArray *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  pixelArray *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  
  array_00 = (pixelArray *)
             std::operator<<((ostream *)&std::cout,
                             "Testing pixel data types, subsampling and compression schemes");
  std::ostream::operator<<(array_00,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_762d5::pixelArray::pixelArray
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  anon_unknown.dwarf_762d5::fillPixels1
            (array_00,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18
            );
  anon_unknown.dwarf_762d5::writeRead
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  anon_unknown.dwarf_762d5::fillPixels2
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
  anon_unknown.dwarf_762d5::writeRead
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  anon_unknown.dwarf_762d5::fillPixels3
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  anon_unknown.dwarf_762d5::writeRead
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  anon_unknown.dwarf_762d5::fillPixels4
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  anon_unknown.dwarf_762d5::writeRead
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  this = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_762d5::pixelArray::~pixelArray(array_00);
  return;
}

Assistant:

void
testCompression (const std::string& tempDir)
{
    try
    {
        cout << "Testing pixel data types, "
                "subsampling and "
                "compression schemes"
             << endl;

        const int W  = 1371;
        const int H  = 159;
        const int DX = 17;
        const int DY = 29;

        pixelArray array (H, W);

        //
        // If the following assertion fails, new pixel types have
        // been added to the Imf library; testing code for the new
        // pixel types should be added to this file.
        //

        assert (NUM_PIXELTYPES == 3);

        fillPixels1 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels2 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels3 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels4 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}